

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O2

Mat_<double> *
MagnitudeSpectrogram
          (Mat_<double> *__return_storage_ptr__,Mat_<float> *emphasis_data,int n_fft,int hop_length,
          int win_length)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  float *_data;
  void *__child_stack;
  int iVar5;
  ulong uVar6;
  int iVar7;
  void *__arg;
  ulong uVar8;
  double dVar9;
  __uniq_ptr_impl<audiofft::detail::AudioFFTImpl,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
  local_430;
  Mat_<double> *local_428;
  long local_420;
  long local_418;
  long local_410;
  long local_408;
  _OutputArray local_400;
  Mat_<float> Xrf;
  Mat_<float> feature_vector;
  Mat_<float> framef;
  Mat_<float> cv_feature;
  Mat_<float> cv_mag;
  Mat_<float> cv_padbuffer;
  _InputArray local_a8;
  Mat_<float> Xif;
  
  uVar6 = (ulong)(uint)win_length;
  if (win_length == 0) {
    uVar6 = (ulong)(uint)n_fft;
  }
  iVar5 = (int)uVar6;
  iVar2 = iVar5 / 4;
  if (hop_length != 0) {
    iVar2 = hop_length;
  }
  iVar7 = n_fft / 2;
  cv::Mat_<float>::Mat_(&cv_padbuffer);
  feature_vector._16_8_ = 0;
  framef._16_8_ = 0;
  feature_vector.super_Mat = (Mat)0x5;
  feature_vector._1_3_ = 0x810100;
  framef.super_Mat = (Mat)0x5;
  framef._1_3_ = 0x820100;
  feature_vector._8_8_ = emphasis_data;
  framef._8_8_ = &cv_padbuffer;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&cv_mag);
  cv::copyMakeBorder((_InputArray *)&feature_vector,(_OutputArray *)&framef,0,0,iVar7,iVar7,4,
                     (Scalar_ *)&cv_mag);
  cVar1 = cv::Mat::empty();
  if (cVar1 != '\0') {
    feature_vector.super_Mat = (Mat)0x0;
    feature_vector._1_3_ = 0;
    cv::Mat_<float>::Mat_(&cv_mag,1,n_fft,(float *)&feature_vector);
    cv::Mat::operator=(&hannWindow.super_Mat,&cv_mag.super_Mat);
    cv::Mat::~Mat(&cv_mag.super_Mat);
    if (n_fft - iVar5 == 0 || n_fft < iVar5) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\tn_fft:");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,n_fft);
      poVar4 = std::operator<<(poVar4," > win_length:");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,n_fft);
      std::endl<char,std::char_traits<char>>(poVar4);
      cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
      goto LAB_00104a7d;
    }
    uVar8 = 0;
    if (iVar5 < 1) {
      uVar6 = 0;
    }
    while (uVar6 != uVar8) {
      dVar9 = cos(((double)(int)(uVar8 + 1) * (pi + pi)) / (double)(iVar5 + 1));
      *(float *)(hannWindow._16_8_ + (long)((int)uVar8 + (n_fft - iVar5) / 2) * 4) =
           (float)((1.0 - dVar9) * 0.5);
      uVar8 = uVar8 + 1;
    }
  }
  iVar5 = cv_padbuffer._12_4_ * cv_padbuffer._8_4_ - n_fft;
  iVar7 = iVar7 + 1;
  cv_mag.super_Mat = (Mat)0x0;
  cv_mag._1_3_ = 0;
  cv::Mat_<float>::Mat_(&feature_vector,iVar5 / iVar2 + 1,iVar7,(float *)&cv_mag);
  audiofft::AudioFFT::AudioFFT((AudioFFT *)&local_430);
  local_428 = __return_storage_ptr__;
  audiofft::AudioFFT::init((AudioFFT *)&local_430,(EVP_PKEY_CTX *)(long)n_fft);
  local_418 = (long)iVar2;
  local_410 = (long)iVar5;
  local_420 = local_418 * 4;
  lVar3 = 0;
  for (uVar6 = 0; (long)uVar6 <= local_410; uVar6 = uVar6 + local_418) {
    _data = (float *)(cv_padbuffer._16_8_ + lVar3);
    __arg = (void *)0x0;
    local_408 = lVar3;
    cv::Mat_<float>::Mat_(&cv_mag,1,n_fft,_data,0);
    cv::Mat_<float>::clone(&framef,(__fn *)&cv_mag,__child_stack,(int)_data,__arg);
    cv::Mat::~Mat((Mat *)&cv_mag);
    Xrf._16_8_ = 0;
    Xrf.super_Mat = (Mat)0x5;
    Xrf._1_3_ = 0x810100;
    Xrf._8_8_ = &hannWindow;
    cv::Mat::mul((_InputArray *)&cv_mag,1.0);
    (**(code **)(*(long *)CONCAT44(cv_mag._4_4_,cv_mag._0_4_) + 0x18))
              ((long *)CONCAT44(cv_mag._4_4_,cv_mag._0_4_),(_InputArray *)&cv_mag,&framef,5);
    cv::MatExpr::~MatExpr((MatExpr *)&cv_mag);
    cv::Mat_<float>::Mat_(&Xrf,1,iVar7);
    cv::Mat_<float>::Mat_((Mat_<float> *)&Xif.super_Mat,1,iVar7);
    (*(*(_func_int ***)
        local_430._M_t.
        super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
        .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl)[3])
              (local_430._M_t.
               super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
               .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl,
               framef._16_8_,Xrf._16_8_,Xif._16_8_);
    cv_mag._16_8_ = 0;
    cv_feature._16_8_ = 0;
    cv_mag.super_Mat = (Mat)0x5;
    cv_mag._1_3_ = 0x810100;
    cv_feature._8_8_ = &Xrf;
    cv_feature.super_Mat = (Mat)0x5;
    cv_feature._1_3_ = 0x820100;
    cv_mag._8_8_ = cv_feature._8_8_;
    cv::pow((_InputArray *)&cv_mag,2.0,(_OutputArray *)&cv_feature);
    cv_mag._16_8_ = 0;
    cv_feature._16_8_ = 0;
    cv_mag.super_Mat = (Mat)0x5;
    cv_mag._1_3_ = 0x810100;
    cv_feature.super_Mat = (Mat)0x5;
    cv_feature._1_3_ = 0x820100;
    cv_feature._8_8_ = &Xif.super_Mat;
    cv_mag._8_8_ = &Xif.super_Mat;
    cv::pow((_InputArray *)&cv_mag,2.0,(_OutputArray *)&cv_feature);
    cv::Mat_<float>::Mat_
              (&cv_feature,1,iVar7,
               (float *)((long)(int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 |
                                           uVar6 & 0xffffffff) / (long)iVar2) *
                         *(long *)feature_vector._72_8_ + feature_vector._16_8_),0);
    cv::operator+(&cv_mag.super_Mat,&Xrf.super_Mat);
    cv::_InputArray::_InputArray(&local_a8,(MatExpr *)&cv_mag.super_Mat);
    local_400.super__InputArray.sz.width = 0;
    local_400.super__InputArray.sz.height = 0;
    local_400.super__InputArray.flags = -0x7dfefffb;
    local_400.super__InputArray.obj = &cv_feature.super_Mat;
    cv::sqrt(&local_a8,&local_400);
    cv::MatExpr::~MatExpr((MatExpr *)&cv_mag);
    cv::Mat::~Mat(&cv_feature.super_Mat);
    cv::Mat::~Mat(&Xif.super_Mat);
    cv::Mat::~Mat(&Xrf.super_Mat);
    cv::Mat::~Mat(&framef.super_Mat);
    lVar3 = local_408 + local_420;
  }
  cv::Mat_<float>::Mat_(&cv_mag);
  framef._16_8_ = 0;
  Xrf._16_8_ = 0;
  framef.super_Mat = (Mat)0x5;
  framef._1_3_ = 0x810100;
  framef._8_8_ = &feature_vector;
  Xrf.super_Mat = (Mat)0x5;
  Xrf._1_3_ = 0x820100;
  Xrf._8_8_ = &cv_mag;
  cv::transpose((_InputArray *)&framef,(_OutputArray *)&Xrf);
  __return_storage_ptr__ = local_428;
  cv::Mat_<double>::Mat_(local_428);
  framef._16_8_ = 0;
  framef.super_Mat = (Mat)0x6;
  framef._1_3_ = 0x820100;
  framef._8_8_ = __return_storage_ptr__;
  cv::Mat::convertTo((_OutputArray *)&cv_mag,(int)&framef,1.0,0.0);
  cv::Mat::~Mat(&cv_mag.super_Mat);
  if ((_Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
       )local_430._M_t.
        super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
        .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl !=
      (AudioFFTImpl *)0x0) {
    (*(*(_func_int ***)
        local_430._M_t.
        super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
        .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl)[1])
              (local_430._M_t.
               super__Tuple_impl<0UL,_audiofft::detail::AudioFFTImpl_*,_std::default_delete<audiofft::detail::AudioFFTImpl>_>
               .super__Head_base<0UL,_audiofft::detail::AudioFFTImpl_*,_false>._M_head_impl);
  }
  cv::Mat::~Mat(&feature_vector.super_Mat);
LAB_00104a7d:
  cv::Mat::~Mat(&cv_padbuffer.super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> MagnitudeSpectrogram(const cv::Mat_<float> *emphasis_data, int n_fft = 2048, int hop_length = 0,
                                      int win_length = 0) {
    if (win_length == 0) {
        win_length = n_fft;
    }
    if (hop_length == 0) {
        hop_length = win_length / 4;
    }

    // reflect对称填充
    int pad_lenght = n_fft / 2;
    // 使用opencv里的copyMakeBorder来完成reflect填充
    cv::Mat_<float> cv_padbuffer;
    cv::copyMakeBorder(*emphasis_data, cv_padbuffer, 0, 0, pad_lenght, pad_lenght, cv::BORDER_REFLECT_101);

    // windowing加窗：将每一帧乘以汉宁窗，以增加帧左端和右端的连续性。
    // 生成一个1600长度的hannWindow，并居中到2048长度的
    if (hannWindow.empty()) {
        hannWindow = cv::Mat_<float>(1, n_fft, 0.0f);
        int insert_cnt = 0;
        if (n_fft > win_length) {
            insert_cnt = (n_fft - win_length) / 2;
        } else {
            std::cout << "\tn_fft:" << n_fft << " > win_length:" << n_fft << std::endl;
            return cv::Mat_<double>(0, 0);
        }
        for (int k = 1; k <= win_length; k++) {
            hannWindow(0, k - 1 + insert_cnt) = float(0.5 * (1 - cos(2 * pi * k / (win_length + 1))));
        }
    }
    // opencv虽然有Hann窗生成函数，但是必须要求width > 1，height > 1
    //cv::Mat_<double> cv_hannWindow;
    //cv::createHanningWindow(cv_hannWindow, cv::Size(1, win_length), CV_64FC1);

    int size = cv_padbuffer.rows * cv_padbuffer.cols;//padbuffer.size()
    int number_feature_vectors = (size - n_fft) / hop_length + 1;
    int number_coefficients = n_fft / 2 + 1;
    cv::Mat_<float> feature_vector(number_feature_vectors, number_coefficients, 0.0f);

    audiofft::AudioFFT fft; //将FFT初始化放在循环外，可达到最优速度
    fft.init(size_t(n_fft));
    for (int i = 0; i <= size - n_fft; i += hop_length) {
        // 每次取一段数据
        cv::Mat_<float> framef = cv::Mat_<float>(1, n_fft, (float *) (cv_padbuffer.data) + i).clone();
        // 加hann窗
        framef = framef.mul(hannWindow);

        // 复数：Xrf实数，Xif虚数。
        cv::Mat_<float> Xrf(1, number_coefficients);
        cv::Mat_<float> Xif(1, number_coefficients);
        fft.fft((float *) (framef.data), (float *) (Xrf.data), (float *) (Xif.data));

        // 求模
        cv::pow(Xrf, 2, Xrf);
        cv::pow(Xif, 2, Xif);
        cv::Mat_<float> cv_feature(1, number_coefficients, &(feature_vector[i / hop_length][0]));
        cv::sqrt(Xrf + Xif, cv_feature);
    }
    cv::Mat_<float> cv_mag;
    cv::transpose(feature_vector, cv_mag);
    cv::Mat_<double> mag;
    cv_mag.convertTo(mag, CV_64FC1);

    return mag;
}